

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int read_script_token(char *buf,size_t buflen,osfildef *fp)

{
  int iVar1;
  FILE *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  bool bVar2;
  int c;
  char *p;
  int local_24;
  undefined1 *local_20;
  
  local_24 = fgetc(in_RDX);
  while (iVar1 = isspace(local_24), local_20 = in_RDI, iVar1 != 0) {
    local_24 = fgetc(in_RDX);
  }
  while( true ) {
    bVar2 = false;
    if ((local_20 < in_RDI + in_RSI + -1) && (bVar2 = false, local_24 != 0x3e)) {
      iVar1 = isspace(local_24);
      bVar2 = false;
      if ((iVar1 == 0) && ((bVar2 = false, local_24 != 10 && (bVar2 = false, local_24 != 0xd)))) {
        bVar2 = local_24 != -1;
      }
    }
    if (!bVar2) break;
    *local_20 = (char)local_24;
    local_24 = fgetc(in_RDX);
    local_20 = local_20 + 1;
  }
  *local_20 = 0;
  return local_24;
}

Assistant:

static int read_script_token(char *buf, size_t buflen, osfildef *fp)
{
    char *p;
    int c;

    /* skip leading whitespace */
    for (c = osfgetc(fp) ; isspace(c) ; c = osfgetc(fp)) ;

    /* read from the file until we reach the end of the token */
    for (p = buf ;
         p < buf + buflen - 1
             && c != '>' && !isspace(c)
             && c != '\n' && c != '\r' && c != EOF ; )
    {
        /* store this character */
        *p++ = (char)c;

        /* get the next one */
        c = osfgetc(fp);
    }

    /* null-terminate the token */
    *p = '\0';

    /* return the character that ended the token */
    return c;
}